

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O3

bool __thiscall
gss::innards::HomomorphismModel::_check_degree_compatibility
          (HomomorphismModel *this,int p,int t,uint graphs_to_consider,
          vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
          *patterns_ndss,
          vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
          *targets_ndss,bool do_not_do_nds_yet)

{
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var1;
  pointer pvVar2;
  pointer poVar3;
  long lVar4;
  long lVar5;
  iterator __position;
  long lVar6;
  Proof *pPVar7;
  byte bVar8;
  int iVar9;
  undefined8 uVar10;
  int *piVar11;
  bool bVar12;
  anon_union_128_2_84168a9f_for__data *paVar13;
  int iVar14;
  pointer pvVar15;
  undefined8 uVar16;
  anon_union_128_2_84168a9f_for__data *paVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int *piVar22;
  int *piVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  pointer pvVar27;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __i;
  long lVar28;
  uint uVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  int *piVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [32];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  vector<int,_std::allocator<int>_> n_t;
  vector<int,_std::allocator<int>_> n_p;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> t_nds;
  vector<int,_std::allocator<int>_> t_remaining;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> p_nds;
  SVOBitset np;
  SVOBitset nt;
  vector<int,_std::allocator<int>_> local_258;
  vector<int,_std::allocator<int>_> local_238;
  ulong local_218;
  ulong local_210;
  undefined1 local_208 [16];
  long local_1f8;
  NamedVertex local_1e8;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  *local_1c0;
  vector<int,_std::allocator<int>_> local_1b8;
  undefined1 local_198 [16];
  long local_188;
  NamedVertex local_178;
  vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  *local_150;
  anon_union_128_2_84168a9f_for__data local_148;
  uint local_c8;
  anon_union_128_2_84168a9f_for__data local_b8;
  uint local_38;
  undefined1 auVar36 [32];
  undefined1 auVar38 [32];
  
  local_1c0 = patterns_ndss;
  bVar12 = degree_and_nds_are_preserved
                     (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                      _M_head_impl)->params);
  if (!bVar12) {
    return true;
  }
  if (graphs_to_consider == 0) {
LAB_00129b76:
    if (do_not_do_nds_yet ||
        *(char *)((long)((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                        _M_head_impl)->params + 0x8a) != '\0') {
      return true;
    }
    pvVar2 = (targets_ndss->
             super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((targets_ndss->
        super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish == pvVar2) {
      uVar18 = 0;
      uVar30 = 0;
    }
    else {
      poVar3 = (pvVar2->
               super__Vector_base<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar30 = (ulong)t;
      uVar18 = (long)(pvVar2->
                     super__Vector_base<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)poVar3 >> 5;
      if (uVar30 < uVar18) {
        lVar28 = uVar30 * 0x20;
        if ((graphs_to_consider == 0) ||
           (*(bool *)((long)&poVar3[uVar30].
                             super__Optional_base<std::vector<int,_std::allocator<int>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::vector<int,_std::allocator<int>_>,_true,_false,_false>
                     + 0x18) != false)) {
          if (graphs_to_consider == 0) {
            return true;
          }
        }
        else {
          uVar18 = 0;
          local_150 = targets_ndss;
          do {
            local_148.short_data[2] = 0;
            local_148._0_16_ = (undefined1  [16])0x0;
            pvVar2 = (targets_ndss->
                     super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar19 = ((long)(targets_ndss->
                            super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
                     -0x5555555555555555;
            uVar20 = uVar18;
            if ((uVar19 < uVar18 || uVar19 - uVar18 == 0) ||
               (lVar4 = *(long *)&pvVar2[uVar18].
                                  super__Vector_base<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data, uVar20 = uVar30,
               (ulong)((long)*(pointer *)
                              ((long)&pvVar2[uVar18].
                                      super__Vector_base<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data + 8) - lVar4 >> 5) <= uVar30)
               ) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar20);
            }
            std::optional<std::vector<int,std::allocator<int>>>::operator=
                      ((optional<std::vector<int,std::allocator<int>>> *)(lVar4 + lVar28),
                       (vector<int,_std::allocator<int>_> *)&local_148);
            if ((void *)local_148.short_data[0] != (void *)0x0) {
              operator_delete(local_148.long_data,local_148.short_data[2] - local_148._0_8_);
            }
            iVar26 = (int)uVar18;
            SVOBitset::SVOBitset
                      ((SVOBitset *)&local_148,
                       (SVOBitset *)
                       ((ulong)(this->max_graphs * t + iVar26) * 0x88 +
                       *(long *)&(((this->_imp)._M_t.
                                   super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                   .
                                   super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                  ._M_head_impl)->target_graph_rows).
                                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                       ));
            targets_ndss = local_150;
            uVar20 = (ulong)local_c8;
            uVar16 = &local_148;
            if (0x10 < uVar20) {
              uVar16 = local_148.short_data[0];
            }
            if (uVar20 != 0) {
              iVar25 = 0;
              uVar19 = 0;
LAB_00129cd1:
              uVar32 = *(ulong *)(uVar16 + uVar19 * 8);
              uVar31 = local_c8;
              if (uVar32 == 0) goto code_r0x00129cda;
              iVar14 = 0;
              for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
                iVar14 = iVar14 + 1;
              }
              if (iVar14 + 1 != iVar25) {
                iVar14 = iVar14 - iVar25;
                while( true ) {
                  paVar13 = (anon_union_128_2_84168a9f_for__data *)local_148.long_data;
                  if ((uint)uVar20 < 0x11) {
                    paVar13 = &local_148;
                  }
                  bVar8 = (byte)iVar14 & 0x3f;
                  iVar25 = iVar14 + 0x3f;
                  if (-1 < iVar14) {
                    iVar25 = iVar14;
                  }
                  paVar13->short_data[iVar25 >> 6] =
                       paVar13->short_data[iVar25 >> 6] &
                       (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
                  pvVar2 = (targets_ndss->
                           super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  uVar19 = ((long)(targets_ndss->
                                  super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
                           -0x5555555555555555;
                  uVar20 = uVar18;
                  if ((uVar19 < uVar18 || uVar19 - uVar18 == 0) ||
                     (lVar4 = *(long *)&pvVar2[uVar18].
                                        super__Vector_base<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data, uVar20 = uVar30,
                     (ulong)((long)*(pointer *)
                                    ((long)&pvVar2[uVar18].
                                            super__Vector_base<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data + 8) - lVar4 >> 5) <=
                     uVar30)) {
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar20);
                  }
                  local_b8.short_data[0]._0_4_ =
                       *(int *)(*(long *)(*(long *)&(((this->_imp)._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl)->targets_degrees).
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         + (long)iVar26 * 0x18) + (long)iVar14 * 4);
                  __position._M_current = *(int **)(lVar4 + 8 + lVar28);
                  if (__position._M_current == *(int **)(lVar4 + 0x10 + lVar28)) {
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              ((vector<int,_std::allocator<int>_> *)(lVar4 + lVar28),__position,
                               (int *)local_b8.short_data);
                  }
                  else {
                    *__position._M_current = local_b8.short_data[0]._0_4_;
                    (((vector<int,_std::allocator<int>_> *)(lVar4 + lVar28))->
                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                    _M_finish = __position._M_current + 1;
                  }
                  uVar20 = (ulong)local_c8;
                  uVar16 = &local_148;
                  if (0x10 < uVar20) {
                    uVar16 = local_148.short_data[0];
                  }
                  if (uVar20 == 0) break;
                  iVar25 = 0;
                  uVar19 = 0;
                  while (uVar32 = *(ulong *)(uVar16 + uVar19 * 8), uVar31 = local_c8, uVar32 == 0) {
                    uVar19 = uVar19 + 1;
                    iVar25 = iVar25 + -0x40;
                    if (uVar20 == uVar19) goto LAB_00129d03;
                  }
                  iVar9 = 0;
                  for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
                    iVar9 = iVar9 + 1;
                  }
                  iVar14 = iVar9 - iVar25;
                  if (iVar9 + 1 == iVar25) goto LAB_00129d03;
                }
                goto LAB_00129cef;
              }
              goto LAB_00129d03;
            }
LAB_00129cef:
            uVar31 = 0;
LAB_00129d03:
            pvVar2 = (targets_ndss->
                     super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar19 = ((long)(targets_ndss->
                            super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
                     -0x5555555555555555;
            uVar20 = uVar18;
            if ((uVar19 < uVar18 || uVar19 - uVar18 == 0) ||
               (lVar4 = *(long *)&pvVar2[uVar18].
                                  super__Vector_base<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data, uVar20 = uVar30,
               (ulong)((long)*(pointer *)
                              ((long)&pvVar2[uVar18].
                                      super__Vector_base<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data + 8) - lVar4 >> 5) <= uVar30)
               ) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar20);
            }
            lVar5 = *(long *)(lVar4 + lVar28);
            lVar4 = *(long *)(lVar4 + 8 + lVar28);
            if (lVar5 != lVar4) {
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
                        (lVar5,lVar4,(int)LZCOUNT(lVar4 - lVar5 >> 2) * 2 ^ 0x7e);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
                        (lVar5);
              uVar31 = local_c8;
            }
            if ((0x10 < uVar31) && ((void *)local_148.short_data[0] != (void *)0x0)) {
              operator_delete__(local_148.long_data);
            }
            uVar18 = (ulong)(iVar26 + 1U);
          } while (iVar26 + 1U != graphs_to_consider);
        }
        uVar20 = (ulong)p;
        uVar31 = 0;
        pvVar15 = (local_1c0->
                  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pvVar27 = (local_1c0->
                  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        local_218 = uVar30;
        local_210 = uVar20;
        while( true ) {
          uVar19 = (ulong)uVar31;
          uVar18 = ((long)pvVar27 - (long)pvVar15 >> 3) * -0x5555555555555555;
          uVar30 = uVar19;
          if (uVar18 < uVar19 || uVar18 - uVar19 == 0) break;
          uVar24 = 2;
          uVar32 = 0;
          while( true ) {
            lVar4 = *(long *)&pvVar15[uVar19].
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            uVar18 = ((long)*(pointer *)
                             ((long)&pvVar15[uVar19].
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data + 8) - lVar4 >> 3) *
                     -0x5555555555555555;
            uVar30 = local_210;
            if (uVar18 < local_210 || uVar18 - local_210 == 0) goto LAB_0012acb6;
            lVar5 = *(long *)(lVar4 + uVar20 * 0x18);
            if ((ulong)(*(long *)(lVar4 + 8 + uVar20 * 0x18) - lVar5 >> 2) <= uVar32) break;
            pvVar2 = (targets_ndss->
                     super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar18 = ((long)(targets_ndss->
                            super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
                     -0x5555555555555555;
            uVar30 = uVar19;
            if (uVar18 < uVar19 || uVar18 - uVar19 == 0) goto LAB_0012acb6;
            lVar4 = *(long *)&pvVar2[uVar19].
                              super__Vector_base<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            uVar18 = (long)*(pointer *)
                            ((long)&pvVar2[uVar19].
                                    super__Vector_base<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data + 8) - lVar4 >> 5;
            uVar30 = local_218;
            if (uVar18 <= local_218) goto LAB_0012acb6;
            uVar18 = *(long *)(lVar4 + 8 + lVar28) - *(long *)(lVar4 + lVar28) >> 2;
            uVar30 = uVar32;
            if (uVar18 <= uVar32) goto LAB_0012acb6;
            _Var1._M_head_impl =
                 (this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
            if (*(int *)(*(long *)(lVar4 + lVar28) + uVar32 * 4) < *(int *)(lVar5 + uVar32 * 4)) {
              if (*(long *)&((_Var1._M_head_impl)->proof).
                            super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> == 0
                 ) {
                return false;
              }
              local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (int *)0x0;
              local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (int *)0x0;
              local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (int *)0x0;
              local_188 = 0;
              local_1f8 = 0;
              local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_198 = (undefined1  [16])0x0;
              local_208 = (undefined1  [16])0x0;
              SVOBitset::SVOBitset
                        ((SVOBitset *)&local_148,
                         (SVOBitset *)
                         ((ulong)(this->max_graphs * p + uVar31) * 0x88 +
                         *(long *)&((_Var1._M_head_impl)->pattern_graph_rows).
                                   super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                         ));
              uVar18 = (ulong)local_c8;
              uVar16 = &local_148;
              if (0x10 < uVar18) {
                uVar16 = local_148.short_data[0];
              }
              if (uVar18 == 0) goto LAB_0012a43c;
              iVar26 = 0;
              uVar30 = 0;
              goto LAB_0012a319;
            }
            bVar12 = degree_and_nds_are_exact
                               ((_Var1._M_head_impl)->params,this->pattern_size,this->target_size);
            if (bVar12) {
              pvVar2 = (targets_ndss->
                       super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              uVar18 = ((long)(targets_ndss->
                              super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
                       -0x5555555555555555;
              uVar30 = uVar19;
              if (uVar18 < uVar19 || uVar18 - uVar19 == 0) goto LAB_0012acb6;
              lVar4 = *(long *)&pvVar2[uVar19].
                                super__Vector_base<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                                ._M_impl.super__Vector_impl_data;
              uVar18 = (long)*(pointer *)
                              ((long)&pvVar2[uVar19].
                                      super__Vector_base<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data + 8) - lVar4 >> 5;
              uVar30 = local_218;
              if (uVar18 <= local_218) goto LAB_0012acb6;
              uVar18 = *(long *)(lVar4 + 8 + lVar28) - *(long *)(lVar4 + lVar28) >> 2;
              uVar30 = uVar32;
              if (uVar18 <= uVar32) goto LAB_0012acb6;
              pvVar27 = (local_1c0->
                        super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
              pvVar15 = (local_1c0->
                        super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              uVar21 = ((long)pvVar27 - (long)pvVar15 >> 3) * -0x5555555555555555;
              uVar18 = uVar21;
              uVar30 = uVar19;
              if (uVar21 < uVar19 || uVar21 - uVar19 == 0) goto LAB_0012acb6;
              lVar5 = *(long *)&pvVar15[uVar19].
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data;
              uVar18 = ((long)*(pointer *)
                               ((long)&pvVar15[uVar19].
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data + 8) - lVar5 >> 3) *
                       -0x5555555555555555;
              uVar30 = local_210;
              if (uVar18 < local_210 || uVar18 - local_210 == 0) goto LAB_0012acb6;
              lVar6 = *(long *)(lVar5 + uVar20 * 0x18);
              uVar18 = *(long *)(lVar5 + 8 + uVar20 * 0x18) - lVar6 >> 2;
              uVar30 = uVar32;
              if (uVar18 <= uVar32) goto LAB_0012acb6;
              uVar18 = uVar21;
              if (*(int *)(*(long *)(lVar4 + lVar28) + uVar32 * 4) != *(int *)(lVar6 + uVar32 * 4))
              {
                return false;
              }
            }
            else {
              pvVar27 = (local_1c0->
                        super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
              pvVar15 = (local_1c0->
                        super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              uVar18 = ((long)pvVar27 - (long)pvVar15 >> 3) * -0x5555555555555555;
            }
            uVar32 = (ulong)(uVar24 - 1);
            uVar24 = uVar24 + 1;
            uVar30 = uVar19;
            if (uVar18 <= uVar19) goto LAB_0012acb6;
          }
          uVar31 = uVar31 + 1;
          if (uVar31 == graphs_to_consider) {
            return true;
          }
        }
      }
    }
LAB_0012acb6:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar30,
               uVar18);
  }
  uVar31 = 0;
  while( true ) {
    _Var1._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    lVar28 = (long)(int)uVar31 * 0x18;
    if (*(uint *)(*(long *)(*(long *)&((_Var1._M_head_impl)->targets_degrees).
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           + lVar28) + (long)t * 4) <
        *(uint *)(*(long *)(*(long *)&((_Var1._M_head_impl)->patterns_degrees).
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           + lVar28) + (long)p * 4)) break;
    bVar12 = degree_and_nds_are_exact
                       ((_Var1._M_head_impl)->params,this->pattern_size,this->target_size);
    if ((bVar12) &&
       (_Var1._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl,
       *(int *)(*(long *)(*(long *)&((_Var1._M_head_impl)->targets_degrees).
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         + lVar28) + (long)t * 4) !=
       *(int *)(*(long *)(*(long *)&((_Var1._M_head_impl)->patterns_degrees).
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         + lVar28) + (long)p * 4))) {
      return false;
    }
    uVar31 = uVar31 + 1;
    if (graphs_to_consider == uVar31) goto LAB_00129b76;
  }
  if (*(long *)&((_Var1._M_head_impl)->proof).
                super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> == 0) {
    return false;
  }
  local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  SVOBitset::SVOBitset
            ((SVOBitset *)&local_148,
             (SVOBitset *)
             ((ulong)(this->max_graphs * p + uVar31) * 0x88 +
             *(long *)&((_Var1._M_head_impl)->pattern_graph_rows).
                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
             ));
  uVar24 = this->pattern_size;
  if (uVar24 != 0) {
    uVar18 = 0;
    do {
      uVar16 = &local_148;
      if (0x10 < local_c8) {
        uVar16 = local_148.short_data[0];
      }
      iVar26 = (int)uVar18;
      iVar25 = iVar26 + 0x3f;
      if (-1 < iVar26) {
        iVar25 = iVar26;
      }
      if ((*(ulong *)(uVar16 + (long)(iVar25 >> 6) * 8) >> (uVar18 & 0x3f) & 1) != 0) {
        local_b8.short_data[0]._0_4_ = iVar26;
        if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_238,
                     (iterator)
                     local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)local_b8.short_data);
        }
        else {
          *local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar26;
          local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        uVar24 = this->pattern_size;
      }
      uVar18 = (ulong)(iVar26 + 1U);
    } while (iVar26 + 1U < uVar24);
  }
  SVOBitset::SVOBitset
            ((SVOBitset *)&local_b8,
             (SVOBitset *)
             ((ulong)(this->max_graphs * t + uVar31) * 0x88 +
             *(long *)&(((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                        _M_head_impl)->target_graph_rows).
                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
             ));
  uVar18 = (ulong)local_38;
  paVar13 = (anon_union_128_2_84168a9f_for__data *)
            CONCAT44(local_b8.short_data[0]._4_4_,local_b8.short_data[0]._0_4_);
  paVar17 = &local_b8;
  if (0x10 < uVar18) {
    paVar17 = paVar13;
  }
  if (uVar18 != 0) {
    iVar26 = 0;
    uVar30 = 0;
    while (uVar20 = paVar17->short_data[uVar30], uVar20 == 0) {
      uVar30 = uVar30 + 1;
      iVar26 = iVar26 + -0x40;
      if (uVar18 == uVar30) goto LAB_0012a346;
    }
    iVar25 = 0;
    for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
      iVar25 = iVar25 + 1;
    }
    if (iVar25 + 1 == iVar26) goto LAB_0012a346;
    iVar25 = iVar25 - iVar26;
    while( true ) {
      if ((uint)uVar18 < 0x11) {
        paVar13 = &local_b8;
      }
      bVar8 = (byte)iVar25 & 0x3f;
      iVar26 = iVar25 + 0x3f;
      if (-1 < iVar25) {
        iVar26 = iVar25;
      }
      paVar13->short_data[iVar26 >> 6] =
           paVar13->short_data[iVar26 >> 6] & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
      local_1e8.first = iVar25;
      if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_258,
                   (iterator)
                   local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_1e8.first);
      }
      else {
        *local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = iVar25;
        local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      uVar18 = (ulong)local_38;
      paVar13 = (anon_union_128_2_84168a9f_for__data *)
                CONCAT44(local_b8.short_data[0]._4_4_,local_b8.short_data[0]._0_4_);
      paVar17 = &local_b8;
      if (0x10 < uVar18) {
        paVar17 = paVar13;
      }
      if (uVar18 == 0) break;
      iVar26 = 0;
      uVar30 = 0;
      while (uVar20 = paVar17->short_data[uVar30], uVar20 == 0) {
        uVar30 = uVar30 + 1;
        iVar26 = iVar26 + -0x40;
        if (uVar18 == uVar30) goto LAB_0012a346;
      }
      iVar14 = 0;
      for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
        iVar14 = iVar14 + 1;
      }
      iVar25 = iVar14 - iVar26;
      if (iVar14 + 1 == iVar26) break;
    }
  }
LAB_0012a346:
  pPVar7 = (((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)->
           proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pattern_vertex_for_proof_abi_cxx11_(&local_1e8,this,p);
  target_vertex_for_proof_abi_cxx11_(&local_178,this,t);
  Proof::incompatible_by_degrees(pPVar7,uVar31,&local_1e8,&local_238,&local_178,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.second._M_dataplus._M_p != &local_178.second.field_2) {
    operator_delete(local_178.second._M_dataplus._M_p,
                    local_178.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.second._M_dataplus._M_p != &local_1e8.second.field_2) {
    operator_delete(local_1e8.second._M_dataplus._M_p,
                    local_1e8.second.field_2._M_allocated_capacity + 1);
  }
  if ((0x10 < local_38) &&
     ((void *)CONCAT44(local_b8.short_data[0]._4_4_,local_b8.short_data[0]._0_4_) != (void *)0x0)) {
    operator_delete__((void *)CONCAT44(local_b8.short_data[0]._4_4_,local_b8.short_data[0]._0_4_));
  }
  if ((0x10 < local_c8) && ((void *)local_148.short_data[0] != (void *)0x0)) {
    operator_delete__(local_148.long_data);
  }
  goto LAB_0012a87d;
code_r0x00129cda:
  uVar19 = uVar19 + 1;
  iVar25 = iVar25 + -0x40;
  if (uVar20 == uVar19) goto LAB_00129d03;
  goto LAB_00129cd1;
LAB_0012a319:
  uVar20 = *(ulong *)(uVar16 + uVar30 * 8);
  if (uVar20 == 0) {
    uVar30 = uVar30 + 1;
    iVar26 = iVar26 + -0x40;
    if (uVar18 == uVar30) goto LAB_0012a43c;
    goto LAB_0012a319;
  }
  iVar25 = 0;
  for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
    iVar25 = iVar25 + 1;
  }
  iVar14 = iVar25 - iVar26;
  local_b8.short_data[0]._0_4_ = iVar14;
  if (iVar25 + 1 != iVar26) {
    auVar40 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    while( true ) {
      paVar13 = (anon_union_128_2_84168a9f_for__data *)local_148.long_data;
      if ((uint)uVar18 < 0x11) {
        paVar13 = &local_148;
      }
      bVar8 = (byte)iVar14 & 0x3f;
      iVar26 = iVar14 + 0x3f;
      if (-1 < iVar14) {
        iVar26 = iVar14;
      }
      local_b8.short_data[0]._0_4_ = iVar14;
      paVar13->short_data[iVar26 >> 6] =
           paVar13->short_data[iVar26 >> 6] & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
      lVar28 = *(long *)&(((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                          _M_head_impl)->pattern_graph_rows).
                         super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
      ;
      lVar4 = (ulong)(iVar14 * this->max_graphs + uVar31) * 0x88;
      uVar18 = (ulong)*(uint *)(lVar28 + 0x80 + lVar4);
      if (uVar18 < 0x11) {
        lVar28 = lVar28 + lVar4;
      }
      else {
        lVar28 = *(long *)(lVar28 + lVar4);
      }
      if (uVar18 == 0) {
        local_1e8.first = 0;
      }
      else {
        auVar41 = vpbroadcastq_avx512f();
        uVar30 = 0;
        auVar42 = ZEXT1664((undefined1  [16])0x0);
        do {
          auVar43 = auVar42;
          auVar42 = vpbroadcastq_avx512f();
          auVar42 = vporq_avx512f(auVar42,auVar40);
          uVar20 = vpcmpuq_avx512f(auVar42,auVar41,2);
          auVar42 = vmovdqu64_avx512f(*(undefined1 (*) [64])(lVar28 + uVar30 * 8));
          auVar39._8_8_ = (ulong)((byte)(uVar20 >> 1) & 1) * auVar42._8_8_;
          auVar39._0_8_ = (ulong)((byte)uVar20 & 1) * auVar42._0_8_;
          auVar39._16_8_ = (ulong)((byte)(uVar20 >> 2) & 1) * auVar42._16_8_;
          auVar39._24_8_ = (ulong)((byte)(uVar20 >> 3) & 1) * auVar42._24_8_;
          auVar39._32_8_ = (ulong)((byte)(uVar20 >> 4) & 1) * auVar42._32_8_;
          auVar39._40_8_ = (ulong)((byte)(uVar20 >> 5) & 1) * auVar42._40_8_;
          auVar39._48_8_ = (ulong)((byte)(uVar20 >> 6) & 1) * auVar42._48_8_;
          auVar39._56_8_ = (uVar20 >> 7) * auVar42._56_8_;
          uVar30 = uVar30 + 8;
          auVar42 = vpopcntq_avx512_vpopcntdq(auVar39);
          auVar37 = vpmovqd_avx512f(auVar42);
          auVar37 = vpaddd_avx2(auVar43._0_32_,auVar37);
          auVar42 = ZEXT3264(auVar37);
        } while ((uVar18 + 7 & 0x1fffffff8) != uVar30);
        auVar37 = vmovdqa32_avx512vl(auVar37);
        bVar12 = (bool)((byte)uVar20 & 1);
        auVar34._0_4_ = (uint)bVar12 * auVar37._0_4_ | (uint)!bVar12 * auVar43._0_4_;
        bVar12 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar34._4_4_ = (uint)bVar12 * auVar37._4_4_ | (uint)!bVar12 * auVar43._4_4_;
        bVar12 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar34._8_4_ = (uint)bVar12 * auVar37._8_4_ | (uint)!bVar12 * auVar43._8_4_;
        bVar12 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar34._12_4_ = (uint)bVar12 * auVar37._12_4_ | (uint)!bVar12 * auVar43._12_4_;
        bVar12 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar36._16_4_ = (uint)bVar12 * auVar37._16_4_ | (uint)!bVar12 * auVar43._16_4_;
        auVar36._0_16_ = auVar34;
        bVar12 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar36._20_4_ = (uint)bVar12 * auVar37._20_4_ | (uint)!bVar12 * auVar43._20_4_;
        bVar12 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar36._24_4_ = (uint)bVar12 * auVar37._24_4_ | (uint)!bVar12 * auVar43._24_4_;
        bVar12 = SUB81(uVar20 >> 7,0);
        auVar36._28_4_ = (uint)bVar12 * auVar37._28_4_ | (uint)!bVar12 * auVar43._28_4_;
        auVar34 = vphaddd_avx(auVar36._16_16_,auVar34);
        auVar34 = vphaddd_avx(auVar34,auVar34);
        auVar34 = vphaddd_avx(auVar34,auVar34);
        local_1e8.first = auVar34._0_4_;
      }
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<unsigned_int&,unsigned_int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)local_198,
                 (uint *)local_b8.short_data,(uint *)&local_1e8);
      auVar40 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar18 = (ulong)local_c8;
      uVar16 = &local_148;
      if (0x10 < uVar18) {
        uVar16 = local_148.short_data[0];
      }
      if (uVar18 == 0) break;
      iVar26 = 0;
      uVar30 = 0;
      while (uVar20 = *(ulong *)(uVar16 + uVar30 * 8), uVar20 == 0) {
        uVar30 = uVar30 + 1;
        iVar26 = iVar26 + -0x40;
        if (uVar18 == uVar30) goto LAB_0012a43c;
      }
      iVar25 = 0;
      for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
        iVar25 = iVar25 + 1;
      }
      iVar14 = iVar25 - iVar26;
      local_b8.short_data[0]._0_4_ = iVar14;
      if (iVar25 + 1 == iVar26) break;
    }
  }
LAB_0012a43c:
  SVOBitset::SVOBitset
            ((SVOBitset *)&local_b8,
             (SVOBitset *)
             ((ulong)(this->max_graphs * t + uVar31) * 0x88 +
             *(long *)&(((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                        _M_head_impl)->target_graph_rows).
                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
             ));
  uVar18 = (ulong)local_38;
  paVar13 = (anon_union_128_2_84168a9f_for__data *)
            CONCAT44(local_b8.short_data[0]._4_4_,local_b8.short_data[0]._0_4_);
  paVar17 = &local_b8;
  if (0x10 < uVar18) {
    paVar17 = paVar13;
  }
  if (uVar18 != 0) {
    iVar26 = 0;
    uVar30 = 0;
    while (uVar20 = paVar17->short_data[uVar30], uVar20 == 0) {
      uVar30 = uVar30 + 1;
      iVar26 = iVar26 + -0x40;
      if (uVar18 == uVar30) goto LAB_0012a4c5;
    }
    iVar25 = 0;
    for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
      iVar25 = iVar25 + 1;
    }
    local_1e8.first = iVar25 - iVar26;
    if (iVar25 + 1 == iVar26) goto LAB_0012a4c5;
    auVar40 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    while( true ) {
      if ((uint)uVar18 < 0x11) {
        paVar13 = &local_b8;
      }
      bVar8 = (byte)local_1e8.first & 0x3f;
      iVar26 = local_1e8.first + 0x3f;
      if (-1 < local_1e8.first) {
        iVar26 = local_1e8.first;
      }
      paVar13->short_data[iVar26 >> 6] =
           paVar13->short_data[iVar26 >> 6] & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
      lVar28 = *(long *)&(((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                          _M_head_impl)->target_graph_rows).
                         super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
      ;
      lVar4 = (ulong)(local_1e8.first * this->max_graphs + uVar31) * 0x88;
      uVar18 = (ulong)*(uint *)(lVar28 + 0x80 + lVar4);
      if (uVar18 < 0x11) {
        lVar28 = lVar28 + lVar4;
      }
      else {
        lVar28 = *(long *)(lVar28 + lVar4);
      }
      if (uVar18 == 0) {
        local_178.first = 0;
      }
      else {
        auVar41 = vpbroadcastq_avx512f();
        uVar30 = 0;
        auVar42 = ZEXT1664((undefined1  [16])0x0);
        do {
          auVar39 = auVar42;
          auVar42 = vpbroadcastq_avx512f();
          auVar42 = vporq_avx512f(auVar42,auVar40);
          uVar20 = vpcmpuq_avx512f(auVar42,auVar41,2);
          auVar42 = vmovdqu64_avx512f(*(undefined1 (*) [64])(lVar28 + uVar30 * 8));
          auVar43._8_8_ = (ulong)((byte)(uVar20 >> 1) & 1) * auVar42._8_8_;
          auVar43._0_8_ = (ulong)((byte)uVar20 & 1) * auVar42._0_8_;
          auVar43._16_8_ = (ulong)((byte)(uVar20 >> 2) & 1) * auVar42._16_8_;
          auVar43._24_8_ = (ulong)((byte)(uVar20 >> 3) & 1) * auVar42._24_8_;
          auVar43._32_8_ = (ulong)((byte)(uVar20 >> 4) & 1) * auVar42._32_8_;
          auVar43._40_8_ = (ulong)((byte)(uVar20 >> 5) & 1) * auVar42._40_8_;
          auVar43._48_8_ = (ulong)((byte)(uVar20 >> 6) & 1) * auVar42._48_8_;
          auVar43._56_8_ = (uVar20 >> 7) * auVar42._56_8_;
          uVar30 = uVar30 + 8;
          auVar42 = vpopcntq_avx512_vpopcntdq(auVar43);
          auVar37 = vpmovqd_avx512f(auVar42);
          auVar37 = vpaddd_avx2(auVar39._0_32_,auVar37);
          auVar42 = ZEXT3264(auVar37);
        } while ((uVar18 + 7 & 0x1fffffff8) != uVar30);
        auVar37 = vmovdqa32_avx512vl(auVar37);
        bVar12 = (bool)((byte)uVar20 & 1);
        auVar35._0_4_ = (uint)bVar12 * auVar37._0_4_ | (uint)!bVar12 * auVar39._0_4_;
        bVar12 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar35._4_4_ = (uint)bVar12 * auVar37._4_4_ | (uint)!bVar12 * auVar39._4_4_;
        bVar12 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar35._8_4_ = (uint)bVar12 * auVar37._8_4_ | (uint)!bVar12 * auVar39._8_4_;
        bVar12 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar35._12_4_ = (uint)bVar12 * auVar37._12_4_ | (uint)!bVar12 * auVar39._12_4_;
        bVar12 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar38._16_4_ = (uint)bVar12 * auVar37._16_4_ | (uint)!bVar12 * auVar39._16_4_;
        auVar38._0_16_ = auVar35;
        bVar12 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar38._20_4_ = (uint)bVar12 * auVar37._20_4_ | (uint)!bVar12 * auVar39._20_4_;
        bVar12 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar38._24_4_ = (uint)bVar12 * auVar37._24_4_ | (uint)!bVar12 * auVar39._24_4_;
        bVar12 = SUB81(uVar20 >> 7,0);
        auVar38._28_4_ = (uint)bVar12 * auVar37._28_4_ | (uint)!bVar12 * auVar39._28_4_;
        auVar34 = vphaddd_avx(auVar38._16_16_,auVar35);
        auVar34 = vphaddd_avx(auVar34,auVar34);
        auVar34 = vphaddd_avx(auVar34,auVar34);
        local_178.first = auVar34._0_4_;
      }
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<unsigned_int&,unsigned_int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)local_208,
                 (uint *)&local_1e8,(uint *)&local_178);
      auVar40 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar18 = (ulong)local_38;
      paVar13 = (anon_union_128_2_84168a9f_for__data *)
                CONCAT44(local_b8.short_data[0]._4_4_,local_b8.short_data[0]._0_4_);
      paVar17 = &local_b8;
      if (0x10 < uVar18) {
        paVar17 = paVar13;
      }
      if (uVar18 == 0) break;
      iVar26 = 0;
      uVar30 = 0;
      while (uVar20 = paVar17->short_data[uVar30], uVar20 == 0) {
        uVar30 = uVar30 + 1;
        iVar26 = iVar26 + -0x40;
        if (uVar18 == uVar30) goto LAB_0012a4c5;
      }
      iVar25 = 0;
      for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
        iVar25 = iVar25 + 1;
      }
      local_1e8.first = iVar25 - iVar26;
      if (iVar25 + 1 == iVar26) break;
    }
  }
LAB_0012a4c5:
  uVar16 = local_198._0_8_;
  uVar10 = local_198._8_8_;
  if (local_198._0_8_ != local_198._8_8_) {
    lVar28 = local_198._8_8_ - local_198._0_8_;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::_check_degree_compatibility(int,int,unsigned_int,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&,std::vector<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>,std::allocator<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>>>&,bool)const::__0>>
              (local_198._0_8_,local_198._8_8_,(int)LZCOUNT(lVar28 >> 3) * 2 ^ 0x7e);
    if (lVar28 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::_check_degree_compatibility(int,int,unsigned_int,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&,std::vector<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>,std::allocator<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>>>&,bool)const::__0>>
                (uVar16,uVar10);
    }
    else {
      piVar23 = (int *)(uVar16 + 0x80);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::_check_degree_compatibility(int,int,unsigned_int,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&,std::vector<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>,std::allocator<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>>>&,bool)const::__0>>
                (uVar16,piVar23);
      if (piVar23 != (int *)uVar10) {
        piVar33 = (int *)(uVar16 + 0x84);
        do {
          uVar16 = *(undefined8 *)piVar23;
          iVar26 = piVar23[-1];
          iVar25 = (int)((ulong)uVar16 >> 0x20);
          piVar22 = piVar23;
          piVar11 = piVar33;
          if (iVar26 < iVar25) {
            do {
              piVar22 = piVar11;
              piVar22[-1] = piVar22[-3];
              *piVar22 = iVar26;
              piVar11 = piVar22 + -2;
              iVar26 = piVar22[-4];
            } while (piVar22[-4] < iVar25);
            piVar22 = piVar22 + -3;
          }
          piVar23 = piVar23 + 2;
          piVar33 = piVar33 + 2;
          *piVar22 = (int)uVar16;
          piVar22[1] = iVar25;
        } while (piVar23 != (int *)uVar10);
      }
    }
  }
  uVar16 = local_208._0_8_;
  uVar10 = local_208._8_8_;
  if (local_208._0_8_ != local_208._8_8_) {
    lVar28 = local_208._8_8_ - local_208._0_8_;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::_check_degree_compatibility(int,int,unsigned_int,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&,std::vector<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>,std::allocator<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>>>&,bool)const::__1>>
              (local_208._0_8_,local_208._8_8_,(int)LZCOUNT(lVar28 >> 3) * 2 ^ 0x7e);
    if (lVar28 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::_check_degree_compatibility(int,int,unsigned_int,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&,std::vector<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>,std::allocator<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>>>&,bool)const::__1>>
                (uVar16,uVar10);
    }
    else {
      piVar23 = (int *)(uVar16 + 0x80);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::_check_degree_compatibility(int,int,unsigned_int,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&,std::vector<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>,std::allocator<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>>>&,bool)const::__1>>
                (uVar16,piVar23);
      if (piVar23 != (int *)uVar10) {
        piVar33 = (int *)(uVar16 + 0x84);
        do {
          uVar16 = *(undefined8 *)piVar23;
          iVar26 = piVar23[-1];
          iVar25 = (int)((ulong)uVar16 >> 0x20);
          piVar22 = piVar23;
          piVar11 = piVar33;
          if (iVar26 < iVar25) {
            do {
              piVar22 = piVar11;
              piVar22[-1] = piVar22[-3];
              *piVar22 = iVar26;
              piVar11 = piVar22 + -2;
              iVar26 = piVar22[-4];
            } while (piVar22[-4] < iVar25);
            piVar22 = piVar22 + -3;
          }
          piVar23 = piVar23 + 2;
          piVar33 = piVar33 + 2;
          *piVar22 = (int)uVar16;
          piVar22[1] = iVar25;
        } while (piVar23 != (int *)uVar10);
      }
    }
  }
  uVar29 = 0;
  do {
    piVar23 = (int *)(local_198._0_8_ + (ulong)uVar29 * 8);
    if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_238,
                 (iterator)
                 local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,piVar23);
    }
    else {
      *local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = *piVar23;
      local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    piVar23 = (int *)((ulong)uVar29 * 8 + local_208._0_8_);
    if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_258,
                 (iterator)
                 local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,piVar23);
    }
    else {
      *local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = *piVar23;
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    uVar29 = uVar29 + 1;
  } while (uVar29 <= uVar24 - 2);
  uVar18 = (ulong)(uVar24 - 1);
  if (uVar18 < (ulong)((long)(local_208._8_8_ - local_208._0_8_) >> 3)) {
    do {
      piVar23 = (int *)(local_208._0_8_ + uVar18 * 8);
      if (local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_1b8,
                   (iterator)
                   local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,piVar23);
      }
      else {
        *local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = *piVar23;
        local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      uVar18 = (ulong)uVar24;
      uVar24 = uVar24 + 1;
    } while (uVar18 < (ulong)((long)(local_208._8_8_ - local_208._0_8_) >> 3));
  }
  pPVar7 = (((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)->
           proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pattern_vertex_for_proof_abi_cxx11_(&local_1e8,this,p);
  target_vertex_for_proof_abi_cxx11_(&local_178,this,t);
  Proof::incompatible_by_nds(pPVar7,uVar31,&local_1e8,&local_178,&local_238,&local_258,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.second._M_dataplus._M_p != &local_178.second.field_2) {
    operator_delete(local_178.second._M_dataplus._M_p,
                    local_178.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.second._M_dataplus._M_p != &local_1e8.second.field_2) {
    operator_delete(local_1e8.second._M_dataplus._M_p,
                    local_1e8.second.field_2._M_allocated_capacity + 1);
  }
  if ((0x10 < local_38) &&
     ((void *)CONCAT44(local_b8.short_data[0]._4_4_,local_b8.short_data[0]._0_4_) != (void *)0x0)) {
    operator_delete__((void *)CONCAT44(local_b8.short_data[0]._4_4_,local_b8.short_data[0]._0_4_));
  }
  if ((0x10 < local_c8) && ((void *)local_148.short_data[0] != (void *)0x0)) {
    operator_delete__(local_148.long_data);
  }
  if ((void *)local_208._0_8_ != (void *)0x0) {
    operator_delete((void *)local_208._0_8_,local_1f8 - local_208._0_8_);
  }
  if ((void *)local_198._0_8_ != (void *)0x0) {
    operator_delete((void *)local_198._0_8_,local_188 - local_198._0_8_);
  }
  if (local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_0012a87d:
  if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return false;
}

Assistant:

auto HomomorphismModel::_check_degree_compatibility(
    int p,
    int t,
    unsigned graphs_to_consider,
    vector<vector<vector<int>>> & patterns_ndss,
    vector<vector<optional<vector<int>>>> & targets_ndss,
    bool do_not_do_nds_yet) const -> bool
{
    if (! degree_and_nds_are_preserved(_imp->params))
        return true;

    for (unsigned g = 0; g < graphs_to_consider; ++g) {
        if (target_degree(g, t) < pattern_degree(g, p)) {
            // not ok, degrees differ
            if (_imp->proof) {
                // get the actual neighbours of p and t, in their original terms
                vector<int> n_p, n_t;

                auto np = pattern_graph_row(g, p);
                for (unsigned j = 0; j < pattern_size; ++j)
                    if (np.test(j))
                        n_p.push_back(j);

                auto nt = target_graph_row(g, t);
                for (auto j = nt.find_first(); j != decltype(nt)::npos; j = nt.find_first()) {
                    nt.reset(j);
                    n_t.push_back(j);
                }

                _imp->proof->incompatible_by_degrees(g, pattern_vertex_for_proof(p), n_p,
                    target_vertex_for_proof(t), n_t);
            }
            return false;
        }
        else if (degree_and_nds_are_exact(_imp->params, pattern_size, target_size) && target_degree(g, t) != pattern_degree(g, p)) {
            // not ok, degrees must be exactly the same
            return false;
        }
    }
    if (_imp->params.no_nds || do_not_do_nds_yet)
        return true;

    // full compare of neighbourhood degree sequences
    if (! targets_ndss.at(0).at(t)) {
        for (unsigned g = 0; g < graphs_to_consider; ++g) {
            targets_ndss.at(g).at(t) = vector<int>{};
            auto ni = target_graph_row(g, t);
            for (auto j = ni.find_first(); j != decltype(ni)::npos; j = ni.find_first()) {
                ni.reset(j);
                targets_ndss.at(g).at(t)->push_back(target_degree(g, j));
            }
            sort(targets_ndss.at(g).at(t)->begin(), targets_ndss.at(g).at(t)->end(), greater<int>());
        }
    }

    for (unsigned g = 0; g < graphs_to_consider; ++g) {
        for (unsigned x = 0; x < patterns_ndss.at(g).at(p).size(); ++x) {
            if (targets_ndss.at(g).at(t)->at(x) < patterns_ndss.at(g).at(p).at(x)) {
                if (_imp->proof) {
                    vector<int> p_subsequence, t_subsequence, t_remaining;

                    // need to know the NDS together with the actual vertices
                    vector<pair<int, int>> p_nds, t_nds;

                    auto np = pattern_graph_row(g, p);
                    for (auto w = np.find_first(); w != decltype(np)::npos; w = np.find_first()) {
                        np.reset(w);
                        p_nds.emplace_back(w, pattern_graph_row(g, w).count());
                    }

                    auto nt = target_graph_row(g, t);
                    for (auto w = nt.find_first(); w != decltype(nt)::npos; w = nt.find_first()) {
                        nt.reset(w);
                        t_nds.emplace_back(w, target_graph_row(g, w).count());
                    }

                    sort(p_nds.begin(), p_nds.end(), [](const pair<int, int> & a, const pair<int, int> & b) { return a.second > b.second; });
                    sort(t_nds.begin(), t_nds.end(), [](const pair<int, int> & a, const pair<int, int> & b) { return a.second > b.second; });

                    for (unsigned y = 0; y <= x; ++y) {
                        p_subsequence.push_back(p_nds[y].first);
                        t_subsequence.push_back(t_nds[y].first);
                    }
                    for (unsigned y = x + 1; y < t_nds.size(); ++y)
                        t_remaining.push_back(t_nds[y].first);

                    _imp->proof->incompatible_by_nds(g, pattern_vertex_for_proof(p),
                        target_vertex_for_proof(t), p_subsequence, t_subsequence, t_remaining);
                }
                return false;
            }
            else if (degree_and_nds_are_exact(_imp->params, pattern_size, target_size) && targets_ndss.at(g).at(t)->at(x) != patterns_ndss.at(g).at(p).at(x))
                return false;
        }
    }

    return true;
}